

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astMessageSendNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  bool bVar1;
  _Bool _Var2;
  sysbvm_tuple_t *psVar3;
  size_t slotCount;
  size_t local_1c8;
  size_t i_1;
  sysbvm_stackFrameGCRootsRecord_t callFrameStackRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  size_t i;
  size_t applicationArgumentCount;
  undefined1 auStack_d8 [7];
  _Bool hasReceiver;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_88_11_921f8105 gcFrame;
  sysbvm_astMessageSendNode_t **sendNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar3 = arguments + 1;
  gcFrame.receiverString = (sysbvm_tuple_t)arguments;
  memset(&gcFrameRecord.roots,0,0x58);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type =
       SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP|
       SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  _auStack_d8 = (sysbvm_stackFrameRecord_s *)0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*(long *)gcFrame.receiverString + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)auStack_d8);
  bVar1 = false;
  slotCount = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*(long *)gcFrame.receiverString + 0x40));
  if (*(long *)(*(long *)gcFrame.receiverString + 0x28) == 0) {
    gcFrame.receiver =
         sysbvm_interpreter_evaluateASTWithEnvironment
                   (context,*(sysbvm_tuple_t *)(*(long *)gcFrame.receiverString + 0x38),*psVar3);
    _Var2 = sysbvm_environment_lookSymbolRecursively
                      (context,*psVar3,gcFrame.receiver,&gcFrame.method);
    if ((!_Var2) || (_Var2 = sysbvm_symbolBinding_isValue(context,gcFrame.method), !_Var2)) {
      sysbvm_error("Failed to find symbol for message send without receiver.");
    }
    gcFrame.selector = sysbvm_symbolValueBinding_getValue(gcFrame.method);
  }
  else {
    gcFrame.receiverType =
         sysbvm_interpreter_evaluateASTWithEnvironment
                   (context,*(sysbvm_tuple_t *)(*(long *)gcFrame.receiverString + 0x28),*psVar3);
    bVar1 = true;
    if (*(long *)(*(long *)gcFrame.receiverString + 0x30) == 0) {
      gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_tuple_getType(context,gcFrame.receiverType);
    }
    else {
      gcFrameRecord.roots =
           (sysbvm_tuple_t *)
           sysbvm_interpreter_evaluateASTWithEnvironment
                     (context,*(sysbvm_tuple_t *)(*(long *)gcFrame.receiverString + 0x30),*psVar3);
    }
    gcFrame.receiver =
         sysbvm_interpreter_evaluateASTWithEnvironment
                   (context,*(sysbvm_tuple_t *)(*(long *)gcFrame.receiverString + 0x38),*psVar3);
    gcFrame.selector =
         sysbvm_type_lookupSelector(context,(sysbvm_tuple_t)gcFrameRecord.roots,gcFrame.receiver);
    if (gcFrame.selector == 0) {
      gcFrame.selector =
           sysbvm_type_lookupSelector
                     (context,(sysbvm_tuple_t)gcFrameRecord.roots,
                      (context->roots).doesNotUnderstandSelector);
      if (gcFrame.selector == 0) {
        sysbvm_error("Message not understood.");
      }
      gcFrame.argument = sysbvm_array_create(context,slotCount);
      for (callFrameStack.gcRoots.applicationArguments[0xf] = 0;
          callFrameStack.gcRoots.applicationArguments[0xf] < slotCount;
          callFrameStack.gcRoots.applicationArguments[0xf] =
               callFrameStack.gcRoots.applicationArguments[0xf] + 1) {
        gcFrame.methodBinding =
             sysbvm_array_at(*(sysbvm_tuple_t *)(*(long *)gcFrame.receiverString + 0x40),
                             callFrameStack.gcRoots.applicationArguments[0xf]);
        gcFrame.argumentNode =
             sysbvm_interpreter_evaluateASTWithEnvironment(context,gcFrame.methodBinding,*psVar3);
        sysbvm_array_atPut(gcFrame.argumentNode,callFrameStack.gcRoots.applicationArguments[0xf],
                           gcFrame.argumentNode);
      }
      gcFrame.arguments =
           sysbvm_message_create
                     (context,gcFrame.receiver,gcFrame.argument,(sysbvm_tuple_t)gcFrameRecord.roots,
                      *(sysbvm_tuple_t *)(*(long *)gcFrame.receiverString + 0x10));
      gcFrame.message =
           sysbvm_function_applyNoCheck2
                     (context,gcFrame.selector,gcFrame.receiverType,gcFrame.arguments);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_d8);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      return gcFrame.message;
    }
  }
  memset(&callFrameStackRecord.roots,0,0xb0);
  memset(&i_1,0,0x20);
  callFrameStackRecord.previous._0_4_ = 0;
  callFrameStackRecord.type = 0x11;
  callFrameStackRecord._12_4_ = 0;
  callFrameStackRecord.rootCount = (size_t)&callFrameStack.argumentIndex;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&i_1);
  sysbvm_functionCallFrameStack_begin
            (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,gcFrame.selector
             ,slotCount + (long)(int)(uint)bVar1,0);
  if (bVar1) {
    sysbvm_functionCallFrameStack_push
              ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,gcFrame.receiverType);
  }
  for (local_1c8 = 0; local_1c8 < slotCount; local_1c8 = local_1c8 + 1) {
    gcFrame.methodBinding =
         sysbvm_array_at(*(sysbvm_tuple_t *)(*(long *)gcFrame.receiverString + 0x40),local_1c8);
    gcFrame.argumentNode =
         sysbvm_interpreter_evaluateASTWithEnvironment(context,gcFrame.methodBinding,*psVar3);
    sysbvm_functionCallFrameStack_push
              ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,gcFrame.argumentNode);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&i_1);
  gcFrame.message =
       sysbvm_functionCallFrameStack_finish
                 (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_d8);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return gcFrame.message;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageSendNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMessageSendNode_t **sendNode = (sysbvm_astMessageSendNode_t**)node;
    struct {
        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t receiver;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t method;
        sysbvm_tuple_t methodBinding;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argument;
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t message;
        sysbvm_tuple_t result;

        sysbvm_tuple_t receiverString;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*sendNode)->super.sourcePosition);

    bool hasReceiver = false;
    size_t applicationArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
    if((*sendNode)->receiver)
    {
        gcFrame.receiver = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*sendNode)->receiver, *environment);
        hasReceiver = true;

        if((*sendNode)->receiverLookupType)
            gcFrame.receiverType = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*sendNode)->receiverLookupType, *environment);
        else
            gcFrame.receiverType = sysbvm_tuple_getType(context, gcFrame.receiver);
        gcFrame.selector = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*sendNode)->selector, *environment);
        gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, gcFrame.selector);
        if(!gcFrame.method)
        {
            gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
            if(!gcFrame.method)
                sysbvm_error("Message not understood.");

            gcFrame.arguments = sysbvm_array_create(context, applicationArgumentCount);
            for(size_t i = 0; i < applicationArgumentCount; ++i)
            {
                gcFrame.argumentNode = sysbvm_array_at((*sendNode)->arguments, i);
                gcFrame.argument = sysbvm_interpreter_evaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
                sysbvm_array_atPut(gcFrame.argument, i, gcFrame.argument);
            }

            gcFrame.message = sysbvm_message_create(context, gcFrame.selector, gcFrame.arguments, gcFrame.receiverType, (*sendNode)->super.sourcePosition);
            gcFrame.result = sysbvm_function_applyNoCheck2(context, gcFrame.method, gcFrame.receiver, gcFrame.message);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return gcFrame.result;
        }
    }
    else
    {
        gcFrame.selector = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*sendNode)->selector, *environment);
        if(!sysbvm_environment_lookSymbolRecursively(context, *environment, gcFrame.selector, &gcFrame.methodBinding)
            || !sysbvm_symbolBinding_isValue(context, gcFrame.methodBinding))
            sysbvm_error("Failed to find symbol for message send without receiver.");
        gcFrame.method = sysbvm_symbolValueBinding_getValue(gcFrame.methodBinding);
    }


    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.method, applicationArgumentCount + (hasReceiver ? 1 : 0), 0);

    if(hasReceiver)
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.receiver);

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*sendNode)->arguments, i);
        gcFrame.argument = sysbvm_interpreter_evaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.argument);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    gcFrame.result = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}